

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QString * __thiscall QMimeData::html(QMimeData *this)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QVariant data;
  QString *in_stack_00000100;
  QMimeDataPrivate *in_stack_00000108;
  QMetaType in_stack_00000408;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QVariant *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMimeData *)0x3e633d);
  textHtmlLiteral();
  QMetaType::QMetaType((QMetaType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  QMimeDataPrivate::retrieveTypedData(in_stack_00000108,in_stack_00000100,in_stack_00000408);
  QString::~QString((QString *)0x3e63a7);
  ::QVariant::toString((QVariant *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ::QVariant::~QVariant(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeData::html() const
{
    Q_D(const QMimeData);
    QVariant data = d->retrieveTypedData(textHtmlLiteral(), QMetaType(QMetaType::QString));
    return data.toString();
}